

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

SourceFunctionNode __thiscall CmdLineArgsParser::ParseSourceFunctionIds(CmdLineArgsParser *this)

{
  char16 cVar1;
  uint uVar2;
  uint local_20;
  LocalFunctionId local_1c;
  uint sourceId;
  uint functionId;
  CmdLineArgsParser *this_local;
  
  cVar1 = CurChar(this);
  if (cVar1 == L'*') {
    local_20 = 1;
    local_1c = 0xfffffffe;
    NextChar(this);
  }
  else {
    cVar1 = CurChar(this);
    if (cVar1 == L'+') {
      local_20 = 1;
      local_1c = 0xffffffff;
      NextChar(this);
    }
    else {
      uVar2 = ParseInteger(this);
      cVar1 = CurChar(this);
      if (cVar1 == L'.') {
        NextChar(this);
        cVar1 = CurChar(this);
        local_20 = uVar2;
        if (cVar1 == L'*') {
          local_1c = 0xfffffffe;
          NextChar(this);
        }
        else {
          cVar1 = CurChar(this);
          if (cVar1 == L'+') {
            local_1c = 0xffffffff;
            NextChar(this);
          }
          else {
            local_1c = ParseInteger(this);
          }
        }
      }
      else {
        local_20 = 1;
        local_1c = uVar2;
      }
    }
  }
  Js::SourceFunctionNode::SourceFunctionNode((SourceFunctionNode *)&this_local,local_20,local_1c);
  return (SourceFunctionNode)this_local;
}

Assistant:

Js::SourceFunctionNode
CmdLineArgsParser::ParseSourceFunctionIds()
{
    uint functionId, sourceId;

    if ('*' == CurChar())
    {
        sourceId = 1;
        functionId = (uint)-2;
        NextChar();
    }
    else if ('+' == CurChar())
    {
        sourceId = 1;
        functionId = (uint)-1;
        NextChar();
    }
    else
    {
        functionId = sourceId = ParseInteger();

        if ('.' == CurChar())
        {
            NextChar();
            if ('*' == CurChar())
            {
                functionId = (uint)-2;
                NextChar();
            }
            else if ('+' == CurChar())
            {
                functionId = (uint)-1;
                NextChar();
            }
            else
            {
                functionId = ParseInteger();
            }
        }
        else
        {
            sourceId = 1;
        }
    }
    return SourceFunctionNode(sourceId, functionId);
}